

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

void __thiscall
Bipartition::setPartition
          (Bipartition *this,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *edge)

{
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)this,edge);
  return;
}

Assistant:

void Bipartition::setPartition(boost::dynamic_bitset<> edge) {
    partition = std::move(edge);
}